

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int64_t roaring_bitmap_get_index(roaring_bitmap_t *bm,uint32_t x)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int i;
  long lVar5;
  array_container_t *arr;
  int64_t iVar6;
  uint16_t local_34;
  
  uVar2 = ra_get_index(&bm->high_low_container,(uint16_t)(x >> 0x10));
  iVar6 = -1;
  if (-1 < (int)uVar2) {
    iVar6 = 0;
    for (lVar5 = 0; lVar5 < (bm->high_low_container).size; lVar5 = lVar5 + 1) {
      uVar3 = (uint)(bm->high_low_container).keys[lVar5];
      if (x >> 0x10 <= uVar3) {
        if (x >> 0x10 != uVar3) {
          return -1;
        }
        arr = (array_container_t *)(bm->high_low_container).containers[uVar2];
        uVar1 = (bm->high_low_container).typecodes[uVar2];
        if (uVar1 == '\x04') {
          uVar1 = *(uint8_t *)&arr->array;
          arr = *(array_container_t **)arr;
        }
        local_34 = (uint16_t)x;
        if (uVar1 == '\x03') {
          uVar2 = run_container_get_index((run_container_t *)arr,local_34);
        }
        else if (uVar1 == '\x02') {
          uVar2 = array_container_get_index(arr,local_34);
        }
        else {
          uVar2 = bitset_container_get_index((bitset_container_t *)arr,local_34);
        }
        if ((int)uVar2 < 0) {
          return -1;
        }
        return iVar6 + (ulong)uVar2;
      }
      iVar4 = container_get_cardinality
                        ((bm->high_low_container).containers[lVar5],
                         (bm->high_low_container).typecodes[lVar5]);
      iVar6 = iVar6 + iVar4;
    }
  }
  return iVar6;
}

Assistant:

int64_t roaring_bitmap_get_index(const roaring_bitmap_t *bm, uint32_t x) {
    int64_t index = 0;
    const uint16_t xhigh = x >> 16;
    int32_t high_idx = ra_get_index(&bm->high_low_container, xhigh);
    if (high_idx < 0) return -1;

    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            index +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            int32_t low_idx = container_get_index(
                bm->high_low_container.containers[high_idx],
                bm->high_low_container.typecodes[high_idx], x & 0xFFFF);
            if (low_idx < 0) return -1;
            return index + low_idx;
        } else {
            return -1;
        }
    }
    return index;
}